

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fProgramInterfaceQueryTests.cpp
# Opt level: O1

void deqp::gles31::Functional::anon_unknown_0::
     generateBufferVariableTopLevelCases<(deqp::gles31::Functional::ProgramResourcePropFlags)32768>
               (Context *context,SharedPtr *parentStructure,TestCaseGroup *targetGroup)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  Node *pNVar2;
  SharedPtrStateBase *pSVar3;
  deInt32 *pdVar4;
  SharedPtr unsized;
  string local_48;
  
  paVar1 = &local_48.field_2;
  local_48._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,0x1b3c1e9);
  generateBufferBackedVariableAggregateTypeCases
            (context,parentStructure,targetGroup,PROGRAMINTERFACE_BUFFER_VARIABLE,
             PROGRAMRESOURCEPROP_TOP_LEVEL_ARRAY_SIZE,TYPE_FLOAT_VEC4,&local_48,3);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != paVar1) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  pNVar2 = (Node *)operator_new(0x28);
  pNVar2->_vptr_Node = (_func_int **)&PTR__Node_021b1ef8;
  pNVar2->m_type = TYPE_ARRAY_ELEMENT;
  (pNVar2->m_enclosingNode).m_ptr = parentStructure->m_ptr;
  pSVar3 = parentStructure->m_state;
  (pNVar2->m_enclosingNode).m_state = pSVar3;
  if (pSVar3 != (SharedPtrStateBase *)0x0) {
    LOCK();
    pSVar3->strongRefCount = pSVar3->strongRefCount + 1;
    UNLOCK();
    LOCK();
    pdVar4 = &((pNVar2->m_enclosingNode).m_state)->weakRefCount;
    *pdVar4 = *pdVar4 + 1;
    UNLOCK();
  }
  pNVar2->_vptr_Node = (_func_int **)&PTR__Node_021b2038;
  *(undefined4 *)&pNVar2[1]._vptr_Node = 0xfffffffe;
  unsized.m_state = (SharedPtrStateBase *)0x0;
  unsized.m_ptr = pNVar2;
  pSVar3 = (SharedPtrStateBase *)operator_new(0x20);
  pSVar3->strongRefCount = 0;
  pSVar3->weakRefCount = 0;
  pSVar3->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_021b1f18;
  pSVar3[1]._vptr_SharedPtrStateBase = (_func_int **)pNVar2;
  pSVar3->strongRefCount = 1;
  pSVar3->weakRefCount = 1;
  unsized.m_state = pSVar3;
  local_48._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"_unsized_array","");
  generateBufferBackedVariableAggregateTypeCases
            (context,&unsized,targetGroup,PROGRAMINTERFACE_BUFFER_VARIABLE,
             PROGRAMRESOURCEPROP_TOP_LEVEL_ARRAY_SIZE,TYPE_FLOAT_VEC4,&local_48,2);
  pdVar4 = &pSVar3->strongRefCount;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != paVar1) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  LOCK();
  *pdVar4 = *pdVar4 + -1;
  UNLOCK();
  if (*pdVar4 == 0) {
    unsized.m_ptr = (Node *)0x0;
    (*(unsized.m_state)->_vptr_SharedPtrStateBase[2])();
  }
  LOCK();
  pdVar4 = &(unsized.m_state)->weakRefCount;
  *pdVar4 = *pdVar4 + -1;
  UNLOCK();
  if ((*pdVar4 == 0) && (unsized.m_state != (SharedPtrStateBase *)0x0)) {
    (*(unsized.m_state)->_vptr_SharedPtrStateBase[1])();
  }
  return;
}

Assistant:

static void generateBufferVariableTopLevelCases (Context& context, const ResourceDefinition::Node::SharedPtr& parentStructure, tcu::TestCaseGroup* targetGroup)
{
	// basic and aggregate types
	generateBufferBackedVariableAggregateTypeCases(context, parentStructure, targetGroup, PROGRAMINTERFACE_BUFFER_VARIABLE, TargetProp, glu::TYPE_FLOAT_VEC4, "", 3);

	// basic and aggregate types in an unsized array
	{
		const ResourceDefinition::Node::SharedPtr unsized(new ResourceDefinition::ArrayElement(parentStructure, ResourceDefinition::ArrayElement::UNSIZED_ARRAY));

		generateBufferBackedVariableAggregateTypeCases(context, unsized, targetGroup, PROGRAMINTERFACE_BUFFER_VARIABLE, TargetProp, glu::TYPE_FLOAT_VEC4, "_unsized_array", 2);
	}
}